

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O3

void __thiscall MainWindow::on_actionAbout_triggered(MainWindow *this)

{
  char *pcVar1;
  storage_type *psVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QString t;
  QString t_1;
  QArrayData *local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  QArrayData *local_100;
  char16_t *local_f8;
  qsizetype qStack_f0;
  QArrayData *local_e8;
  char16_t *local_e0;
  qsizetype qStack_d8;
  QArrayData *local_d0;
  char16_t *local_c8;
  qsizetype qStack_c0;
  QString local_b8;
  QArrayData *local_a0;
  char16_t *local_98;
  qsizetype qStack_90;
  QArrayData *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  QArrayData *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  QString local_48;
  QArrayData *local_30 [3];
  
  pcVar1 = MT32Emu::Synth::getLibraryVersionString();
  if (pcVar1 == (char *)0x0) {
    psVar2 = (storage_type *)0x0;
  }
  else {
    psVar2 = (storage_type *)strlen(pcVar1);
  }
  QVar3.m_data = psVar2;
  QVar3.m_size = (qsizetype)&local_118;
  QString::fromUtf8(QVar3);
  local_68 = local_118;
  uStack_60 = uStack_110;
  local_58 = local_108;
  QVar4.m_data = (storage_type *)0x5;
  QVar4.m_size = (qsizetype)&local_118;
  QString::fromUtf8(QVar4);
  local_88 = local_118;
  uStack_80 = uStack_110;
  local_78 = local_108;
  QVar5.m_data = (storage_type *)0x73;
  QVar5.m_size = (qsizetype)&local_100;
  QString::fromUtf8(QVar5);
  QString::append((QString *)&local_100);
  local_b8.d.d = (Data *)local_100;
  local_b8.d.ptr = local_f8;
  local_b8.d.size = qStack_f0;
  if (local_100 != (QArrayData *)0x0) {
    LOCK();
    (local_100->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_100->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar6.m_data = (storage_type *)0x14;
  QVar6.m_size = (qsizetype)&local_118;
  QString::fromUtf8(QVar6);
  QString::append((QString *)&local_b8);
  if (local_118 != (QArrayData *)0x0) {
    LOCK();
    (local_118->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_118->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_118->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_118,2,8);
    }
  }
  pcVar1 = (char *)qVersion();
  operator+(&local_48,&local_b8,pcVar1);
  local_e8 = &(local_48.d.d)->super_QArrayData;
  local_e0 = local_48.d.ptr;
  qStack_d8 = local_48.d.size;
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar7.m_data = (storage_type *)0x14;
  QVar7.m_size = (qsizetype)&local_118;
  QString::fromUtf8(QVar7);
  QString::append((QString *)&local_e8);
  if (local_118 != (QArrayData *)0x0) {
    LOCK();
    (local_118->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_118->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_118->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_118,2,8);
    }
  }
  QString::number((int)local_30,0x40);
  local_d0 = local_e8;
  local_c8 = local_e0;
  qStack_c0 = qStack_d8;
  if (local_e8 != (QArrayData *)0x0) {
    LOCK();
    (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::append((QString *)&local_d0);
  local_a0 = local_d0;
  local_98 = local_c8;
  qStack_90 = qStack_c0;
  if (local_d0 != (QArrayData *)0x0) {
    LOCK();
    (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar8.m_data = (storage_type *)0x83;
  QVar8.m_size = (qsizetype)&local_118;
  QString::fromUtf8(QVar8);
  QString::append((QString *)&local_a0);
  if (local_118 != (QArrayData *)0x0) {
    LOCK();
    (local_118->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_118->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_118->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_118,2,8);
    }
  }
  QMessageBox::about((QWidget *)this,(QString *)&local_88,(QString *)&local_a0);
  if (local_a0 != (QArrayData *)0x0) {
    LOCK();
    (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a0,2,8);
    }
  }
  if (local_d0 != (QArrayData *)0x0) {
    LOCK();
    (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_d0,2,8);
    }
  }
  if (local_30[0] != (QArrayData *)0x0) {
    LOCK();
    (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30[0],2,8);
    }
  }
  if (local_e8 != (QArrayData *)0x0) {
    LOCK();
    (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_e8,2,8);
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_100 != (QArrayData *)0x0) {
    LOCK();
    (local_100->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_100->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_100->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_100,2,8);
    }
  }
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,8);
    }
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,8);
    }
  }
  return;
}

Assistant:

void MainWindow::on_actionAbout_triggered() {
#ifdef BUILD_MT32EMU_VERSION
	QString mt32emuVersion = BUILD_MT32EMU_VERSION;
#else
	QString mt32emuVersion = MT32Emu::Synth::getLibraryVersionString();
#endif
	QMessageBox::about(this, "About",
		"Munt - Roland (R) MT-32 sound module emulator\n"
		"\n"
		"Munt mt32emu_qt GUI Application Version " MT32EMU_QT_VERSION "\n"
		"Munt Library Version " + mt32emuVersion + "\n"
		"Qt Library Version " + qVersion() + "\n"
		"\n"
		"Build Arch: " BUILD_SYSTEM " " + QString::number(QSysInfo::WordSize) + "-bit\n"
		"Build Date: " BUILD_DATE "\n"
		"\n"
		"Copyright (C) 2011-2022 Jerome Fisher, Sergey V. Mikayev\n"
		"\n"
		"Licensed under GPL v3 or any later version."
	);
}